

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O0

void __thiscall
wasm::TraceCalls::parseFunctionName
          (TraceCalls *this,string *str,string *originName,string *traceName)

{
  size_type sVar1;
  reference pvVar2;
  Fatal *pFVar3;
  Fatal local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  Split parts;
  string *traceName_local;
  string *originName_local;
  string *str_local;
  TraceCalls *this_local;
  
  parts._24_8_ = traceName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,":",&local_69);
  String::Split::Split((Split *)local_48,str,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  if (sVar1 == 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,0);
    std::__cxx11::string::operator=((string *)originName,(string *)pvVar2);
    std::operator+(&local_a0,"trace_",originName);
    std::__cxx11::string::operator=((string *)parts._24_8_,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    if (sVar1 != 2) {
      Fatal::Fatal(&local_228);
      pFVar3 = Fatal::operator<<(&local_228,(char (*) [33])"Failed to parse function name (\'");
      pFVar3 = Fatal::operator<<(pFVar3,str);
      Fatal::operator<<(pFVar3,(char (*) [52])"\'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]"
                       );
      Fatal::~Fatal(&local_228);
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,0);
    std::__cxx11::string::operator=((string *)originName,(string *)pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,1);
    std::__cxx11::string::operator=((string *)parts._24_8_,(string *)pvVar2);
  }
  String::Split::~Split((Split *)local_48);
  return;
}

Assistant:

void parseFunctionName(const std::string& str,
                         std::string& originName,
                         std::string& traceName) {
    auto parts = String::Split(str, ":");
    switch (parts.size()) {
      case 1:
        originName = parts[0];
        traceName = "trace_" + originName;
        break;
      case 2:
        originName = parts[0];
        traceName = parts[1];
        break;
      default:
        Fatal() << "Failed to parse function name ('" << str
                << "'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]";
    }
  }